

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O3

void __thiscall gl4cts::BufferStorageTest::deinit(BufferStorageTest *this)

{
  pointer ppBVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer ppBVar3;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  ppBVar3 = (this->m_testCases).
            super__Vector_base<gl4cts::BufferStorageTestCase_*,_std::allocator<gl4cts::BufferStorageTestCase_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppBVar3 !=
      (this->m_testCases).
      super__Vector_base<gl4cts::BufferStorageTestCase_*,_std::allocator<gl4cts::BufferStorageTestCase_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      (*(*ppBVar3)->_vptr_BufferStorageTestCase[2])();
      if (*ppBVar3 != (BufferStorageTestCase *)0x0) {
        (*(*ppBVar3)->_vptr_BufferStorageTestCase[1])();
      }
      ppBVar3 = ppBVar3 + 1;
    } while (ppBVar3 !=
             (this->m_testCases).
             super__Vector_base<gl4cts::BufferStorageTestCase_*,_std::allocator<gl4cts::BufferStorageTestCase_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    ppBVar1 = (this->m_testCases).
              super__Vector_base<gl4cts::BufferStorageTestCase_*,_std::allocator<gl4cts::BufferStorageTestCase_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppBVar3 != ppBVar1) {
      (this->m_testCases).
      super__Vector_base<gl4cts::BufferStorageTestCase_*,_std::allocator<gl4cts::BufferStorageTestCase_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppBVar1;
    }
  }
  if (this->m_sparse_bo != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x438))(1,&this->m_sparse_bo);
    this->m_sparse_bo = 0;
  }
  return;
}

Assistant:

void BufferStorageTest::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* De-initialize all test the test cases */
	for (TestCasesVectorIterator itTestCase = m_testCases.begin(); itTestCase != m_testCases.end(); ++itTestCase)
	{
		(*itTestCase)->deinitTestCaseGlobal();

		delete (*itTestCase);
	} /* for (all registered test case objects) */

	m_testCases.clear();

	if (m_sparse_bo != 0)
	{
		gl.deleteBuffers(1, &m_sparse_bo);

		m_sparse_bo = 0;
	}
}